

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void variance_double_suite::test_linear_decrease(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  double absolute_tolerance;
  double *in_stack_fffffffffffffd38;
  double local_2b0;
  value_type local_2a8;
  value_type local_2a0;
  double local_290;
  value_type local_288;
  value_type local_280;
  double local_270;
  value_type local_268;
  value_type local_260;
  double local_250;
  value_type local_248;
  value_type local_240;
  double local_230;
  value_type local_228;
  value_type local_220;
  double local_210;
  value_type local_208;
  value_type local_200;
  double local_1f0;
  value_type local_1e8;
  value_type local_1e0;
  double local_1d0;
  value_type local_1c8;
  value_type local_1c0;
  double local_1b0;
  value_type local_1a8;
  value_type local_1a0;
  double local_190;
  value_type local_188;
  value_type local_180;
  double local_170;
  value_type local_168;
  value_type local_160;
  double local_150;
  value_type local_148;
  value_type local_140;
  double local_130;
  value_type local_128;
  value_type local_120;
  double local_110;
  value_type local_108;
  value_type local_100;
  double local_f0;
  value_type local_e8;
  value_type local_e0;
  double local_d0;
  value_type local_c8;
  value_type local_c0;
  double local_b0;
  value_type local_a8;
  value_type local_a0;
  double local_90;
  value_type local_88;
  value_type local_80;
  double local_70;
  value_type local_68 [4];
  undefined1 local_48 [8];
  moment_variance<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.sum,1e-05,absolute_tolerance);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::basic_moment
            ((basic_moment<double,_(trial::online::with)2> *)local_48,0.125,0.25);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,10.0);
  local_68[2] = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_68[1] = 10.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","10.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x180,"void variance_double_suite::test_linear_decrease()",local_68 + 2,local_68 + 1);
  local_68[0] = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                          ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_70 = 0.0;
  local_80 = filter.sum.variance;
  predicate_17.absolute = tolerance.relative;
  predicate_17.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x181,0x1119d4,(char *)local_68,&local_70,in_stack_fffffffffffffd38,
             predicate_17);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,9.0);
  local_88 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_90 = 9.46667;
  local_a0 = filter.sum.variance;
  predicate_16.absolute = tolerance.relative;
  predicate_16.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","9.46667","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x183,0x1119d4,(char *)&local_88,&local_90,in_stack_fffffffffffffd38,
             predicate_16);
  local_a8 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                       ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_b0 = 0.124444;
  local_c0 = filter.sum.variance;
  predicate_15.absolute = tolerance.relative;
  predicate_15.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.124444","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x184,0x1119d4,(char *)&local_a8,&local_b0,in_stack_fffffffffffffd38,
             predicate_15);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,8.0);
  local_c8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_d0 = 8.91124;
  local_e0 = filter.sum.variance;
  predicate_14.absolute = tolerance.relative;
  predicate_14.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","8.91124","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x186,0x1119d4,(char *)&local_c8,&local_d0,in_stack_fffffffffffffd38,
             predicate_14);
  local_e8 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                       ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_f0 = 0.429707;
  local_100 = filter.sum.variance;
  predicate_13.absolute = tolerance.relative;
  predicate_13.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.429707","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x187,0x1119d4,(char *)&local_e8,&local_f0,in_stack_fffffffffffffd38,
             predicate_13);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,7.0);
  local_108 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_110 = 8.33392;
  local_120 = filter.sum.variance;
  predicate_12.absolute = tolerance.relative;
  predicate_12.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","8.33392","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x189,0x1119d4,(char *)&local_108,&local_110,in_stack_fffffffffffffd38,
             predicate_12);
  local_128 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_130 = 0.923291;
  local_140 = filter.sum.variance;
  predicate_11.absolute = tolerance.relative;
  predicate_11.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.923291","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x18a,0x1119d4,(char *)&local_128,&local_130,in_stack_fffffffffffffd38,
             predicate_11);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,6.0);
  local_148 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_150 = 7.73498;
  local_160 = filter.sum.variance;
  predicate_10.absolute = tolerance.relative;
  predicate_10.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","7.73498","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x18c,0x1119d4,(char *)&local_148,&local_150,in_stack_fffffffffffffd38,
             predicate_10);
  local_168 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_170 = 1.60733;
  local_180 = filter.sum.variance;
  predicate_09.absolute = tolerance.relative;
  predicate_09.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.60733","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x18d,0x1119d4,(char *)&local_168,&local_170,in_stack_fffffffffffffd38,
             predicate_09);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,5.0);
  local_188 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_190 = 7.11475;
  local_1a0 = filter.sum.variance;
  predicate_08.absolute = tolerance.relative;
  predicate_08.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","7.11475","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x18f,0x1119d4,(char *)&local_188,&local_190,in_stack_fffffffffffffd38,
             predicate_08);
  local_1a8 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_1b0 = 2.47861;
  local_1c0 = filter.sum.variance;
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","2.47861","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x190,0x1119d4,(char *)&local_1a8,&local_1b0,in_stack_fffffffffffffd38,
             predicate_07);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,4.0);
  local_1c8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_1d0 = 6.47365;
  local_1e0 = filter.sum.variance;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","6.47365","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x192,0x1119d4,(char *)&local_1c8,&local_1d0,in_stack_fffffffffffffd38,
             predicate_06);
  local_1e8 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_1f0 = 3.52889;
  local_200 = filter.sum.variance;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","3.52889","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x193,0x1119d4,(char *)&local_1e8,&local_1f0,in_stack_fffffffffffffd38,
             predicate_05);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,3.0);
  local_208 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_210 = 5.81214;
  local_220 = filter.sum.variance;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.81214","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x195,0x1119d4,(char *)&local_208,&local_210,in_stack_fffffffffffffd38,
             predicate_04);
  local_228 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_230 = 4.7455;
  local_240 = filter.sum.variance;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","4.7455","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x196,0x1119d4,(char *)&local_228,&local_230,in_stack_fffffffffffffd38,
             predicate_03);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,2.0);
  local_248 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_250 = 5.13076;
  local_260 = filter.sum.variance;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.13076","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x198,0x1119d4,(char *)&local_248,&local_250,in_stack_fffffffffffffd38,
             predicate_02);
  local_268 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_270 = 6.11216;
  local_280 = filter.sum.variance;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","6.11216","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x199,0x1119d4,(char *)&local_268,&local_270,in_stack_fffffffffffffd38,
             predicate_01);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,1.0);
  local_288 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_290 = 4.43009;
  local_2a0 = filter.sum.variance;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","4.43009","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x19b,0x1119d4,(char *)&local_288,&local_290,in_stack_fffffffffffffd38,
             predicate_00);
  local_2a8 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_2b0 = 7.60984;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","7.60984","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x19c,0x1119d4,(char *)&local_2a8,&local_2b0,in_stack_fffffffffffffd38,
             predicate);
  return;
}

Assistant:

void test_linear_decrease()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment_variance<double> filter(one_over_eight, one_over_four);
    filter.push(10.0);
    TRIAL_TEST_EQ(filter.mean(), 10.0);
    TRIAL_TEST_WITH(filter.variance(), 0.0, tolerance);
    filter.push(9.0);
    TRIAL_TEST_WITH(filter.mean(), 9.46667, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.124444, tolerance);
    filter.push(8.0);
    TRIAL_TEST_WITH(filter.mean(), 8.91124, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.429707, tolerance);
    filter.push(7.0);
    TRIAL_TEST_WITH(filter.mean(), 8.33392, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.923291, tolerance);
    filter.push(6.0);
    TRIAL_TEST_WITH(filter.mean(), 7.73498, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.60733, tolerance);
    filter.push(5.0);
    TRIAL_TEST_WITH(filter.mean(), 7.11475, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 2.47861, tolerance);
    filter.push(4.0);
    TRIAL_TEST_WITH(filter.mean(), 6.47365, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 3.52889, tolerance);
    filter.push(3.0);
    TRIAL_TEST_WITH(filter.mean(), 5.81214, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 4.7455, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 5.13076, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 6.11216, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 4.43009, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 7.60984, tolerance);
}